

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanConstant<duckdb::hugeint_t>
               (RLEScanState<duckdb::hugeint_t> *scan_state,rle_count_t *index_pointer,
               hugeint_t *data_pointer,idx_t scan_count,Vector *result)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (uint64_t *)result->data;
  uVar2 = data_pointer[scan_state->entry_pos].upper;
  *puVar1 = data_pointer[scan_state->entry_pos].lower;
  puVar1[1] = uVar2;
  uVar3 = scan_count + scan_state->position_in_entry;
  scan_state->position_in_entry = uVar3;
  if (index_pointer[scan_state->entry_pos] <= uVar3) {
    scan_state->entry_pos = scan_state->entry_pos + 1;
    scan_state->position_in_entry = 0;
  }
  return;
}

Assistant:

static void RLEScanConstant(RLEScanState<T> &scan_state, rle_count_t *index_pointer, T *data_pointer, idx_t scan_count,
                            Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<T>(result);
	result_data[0] = data_pointer[scan_state.entry_pos];
	scan_state.position_in_entry += scan_count;
	if (scan_state.ExhaustedRun(index_pointer)) {
		scan_state.ForwardToNextRun();
	}
	return;
}